

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colamd.c
# Opt level: O2

size_t colamd_recommended(int nnz,int n_row,int n_col)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  uint local_3c;
  ulong local_38;
  
  local_3c = 1;
  if ((n_row | nnz | n_col) < 0) {
    return 0;
  }
  sVar1 = t_mult((ulong)(uint)nnz,2,(int *)&local_3c);
  local_38 = (ulong)(uint)n_col;
  uVar5 = 0;
  sVar3 = local_38 + 1;
  if (local_3c == 0) {
    sVar3 = uVar5;
  }
  local_3c = (uint)(local_3c != 0);
  sVar2 = t_mult(sVar3,0x18,(int *)&local_3c);
  sVar3 = (ulong)(uint)n_row + 1;
  if (local_3c == 0) {
    sVar3 = uVar5;
  }
  local_3c = (uint)(local_3c != 0);
  sVar3 = t_mult(sVar3,0x10,(int *)&local_3c);
  if (local_3c == 0) {
    bVar7 = false;
  }
  else {
    uVar6 = sVar2 >> 2;
    uVar5 = sVar1 + uVar6;
    if (uVar6 < sVar1) {
      uVar6 = sVar1;
    }
    if (uVar6 <= uVar5) {
      uVar4 = sVar3 >> 2;
      uVar6 = uVar4 + uVar5;
      if (uVar4 < uVar5) {
        uVar4 = uVar5;
      }
      if (uVar4 <= uVar6) {
        uVar4 = uVar6 + local_38;
        if (local_38 < uVar6) {
          local_38 = uVar6;
        }
        if (local_38 <= uVar4) {
          uVar6 = (ulong)(uint)nnz / 5;
          uVar5 = uVar6;
          if (uVar6 < uVar4) {
            uVar5 = uVar4;
          }
          bVar7 = uVar5 <= uVar4 + uVar6;
          uVar5 = 0;
          if (bVar7) {
            uVar5 = uVar4 + uVar6;
          }
          goto LAB_0010ddb9;
        }
      }
    }
    bVar7 = false;
    uVar5 = 0;
  }
LAB_0010ddb9:
  if (0x7ffffffe < uVar5) {
    uVar5 = 0;
  }
  if (!bVar7) {
    uVar5 = 0;
  }
  return uVar5;
}

Assistant:

PUBLIC size_t COLAMD_recommended	/* returns recommended value of Alen. */
(
    /* === Parameters ======================================================= */

    Int nnz,			/* number of nonzeros in A */
    Int n_row,			/* number of rows in A */
    Int n_col			/* number of columns in A */
)
{
    size_t s, c, r ;
    int ok = TRUE ;
    if (nnz < 0 || n_row < 0 || n_col < 0)
    {
	return (0) ;
    }
    s = t_mult (nnz, 2, &ok) ;	    /* 2*nnz */
    c = COLAMD_C (n_col, &ok) ;	    /* size of column structures */
    r = COLAMD_R (n_row, &ok) ;	    /* size of row structures */
    s = t_add (s, c, &ok) ;
    s = t_add (s, r, &ok) ;
    s = t_add (s, n_col, &ok) ;	    /* elbow room */
    s = t_add (s, nnz/5, &ok) ;	    /* elbow room */
    ok = ok && (s < Int_MAX) ;
    return (ok ? s : 0) ;
}